

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netaddr.c
# Opt level: O1

_Bool netaddr_isequal_binary(netaddr *addr,void *bin,size_t len,uint16_t af,uint8_t prefix_len)

{
  ushort uVar1;
  int iVar2;
  size_t __n;
  
  uVar1 = (ushort)addr->_type;
  if (uVar1 != af) {
    return false;
  }
  if (addr->_prefix_len != prefix_len) {
    return false;
  }
  if (uVar1 < 0x2f) {
    if (uVar1 == 2) {
      __n = 4;
      goto LAB_0012987d;
    }
    if (uVar1 == 10) {
      __n = 0x10;
      goto LAB_0012987d;
    }
  }
  else {
    if (uVar1 == 0x2f) {
      __n = 6;
      goto LAB_0012987d;
    }
    if (uVar1 == 0x30) {
      __n = 8;
      goto LAB_0012987d;
    }
  }
  __n = 0;
LAB_0012987d:
  if (__n != len) {
    return false;
  }
  iVar2 = bcmp(addr,bin,__n);
  return iVar2 == 0;
}

Assistant:

bool
netaddr_isequal_binary(const struct netaddr *addr, const void *bin, size_t len, uint16_t af, uint8_t prefix_len) {
  uint32_t addr_len;

  if (addr->_type != af || addr->_prefix_len != prefix_len) {
    return false;
  }

  addr_len = netaddr_get_maxprefix(addr) >> 3;
  if (addr_len != len) {
    return false;
  }

  return memcmp(addr->_addr, bin, addr_len) == 0;
}